

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

string * __thiscall
booster::locale::gnu_gettext::mo_message<char>::convert_encoding_name
          (string *__return_storage_ptr__,mo_message<char> *this,string *in)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = in->_M_string_length;
  if (uVar3 != 0) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      cVar1 = (in->_M_dataplus)._M_p[uVar4];
      if (((byte)(cVar1 + 0xbfU) < 0x1a) ||
         ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar3 = in->_M_string_length;
      }
      bVar2 = uVar5 < uVar3;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_encoding_name(std::string const &in)
                {
                    std::string result;
                    for(unsigned i=0;i<in.size();i++) {
                        char c=in[i];
                        if('A' <= c && c<='Z')
                            c=c-'A' + 'a';
                        else if(('a' <= c && c<='z') || ('0' <= c && c<='9'))
                            ;
                        else
                            continue;
                        result+=c;
                    }
                    return result;
                }